

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O2

void __thiscall GrpParser::glyphEntry(GrpParser *this)

{
  RefAST *this_00;
  RefAST RVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  NoViableAltException *pNVar5;
  RefAST *child;
  RefAST glyphEntry_AST;
  RefCount<Token> local_80;
  RefAST tmp92_AST;
  ASTPair currentAST;
  RefToken local_50;
  RefToken local_48;
  RefAST local_40;
  RefAST local_38;
  
  this_00 = &(this->super_LLkParser).super_Parser.returnAST;
  RefCount<AST>::operator=(this_00,&nullAST);
  glyphEntry_AST = nullAST;
  currentAST.root.ref = (Ref *)0x0;
  currentAST.child.ref = (Ref *)0x0;
  if (nullAST.ref != (Ref *)0x0) {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  if (iVar3 == 0xd) {
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
    bVar2 = BitSet::member(&_tokenSet_22,iVar3);
    if (!bVar2) goto LAB_0016a3b1;
    glyphContents(this);
    local_38.ref = (this->super_LLkParser).super_Parser.returnAST.ref;
    if (local_38.ref != (Ref *)0x0) {
      (local_38.ref)->count = (local_38.ref)->count + 1;
    }
    child = &local_38;
    ASTFactory::addASTChild(&(this->super_LLkParser).super_Parser.astFactory,&currentAST,child);
  }
  else {
LAB_0016a3b1:
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    if (iVar3 != 0xd) {
LAB_0016a4f4:
      pNVar5 = (NoViableAltException *)__cxa_allocate_exception(0x40);
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_48,this,1);
      NoViableAltException::NoViableAltException(pNVar5,&local_48);
      __cxa_throw(pNVar5,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException
                 );
    }
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
    if (iVar3 != 0xb) {
      iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
      if (iVar3 != 0x12) goto LAB_0016a4f4;
    }
    glyphAttrs(this);
    local_40.ref = (this->super_LLkParser).super_Parser.returnAST.ref;
    if (local_40.ref != (Ref *)0x0) {
      (local_40.ref)->count = (local_40.ref)->count + 1;
    }
    child = &local_40;
    ASTFactory::addASTChild(&(this->super_LLkParser).super_Parser.astFactory,&currentAST,child);
  }
  RefCount<AST>::~RefCount(child);
  uVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  RVar1 = nullAST;
  if (uVar4 < 0x10) {
    if ((0xe600U >> (uVar4 & 0x1f) & 1) == 0) {
      if (uVar4 != 8) goto LAB_0016a53a;
      if (nullAST.ref != (Ref *)0x0) {
        (nullAST.ref)->count = (nullAST.ref)->count + 1;
      }
      tmp92_AST = RVar1;
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_80,this,1);
      ASTFactory::create((ASTFactory *)&stack0xffffffffffffff88,
                         (RefToken *)&(this->super_LLkParser).super_Parser.astFactory);
      RefCount<AST>::operator=(&tmp92_AST,(RefCount<AST> *)&stack0xffffffffffffff88);
      RefCount<AST>::~RefCount((RefCount<AST> *)&stack0xffffffffffffff88);
      RefCount<Token>::~RefCount(&local_80);
      Parser::match((Parser *)this,8);
      RefCount<AST>::~RefCount(&tmp92_AST);
    }
    RefCount<AST>::operator=(&glyphEntry_AST,&currentAST.root);
    RefCount<AST>::operator=(this_00,&glyphEntry_AST);
    RefCount<AST>::~RefCount(&glyphEntry_AST);
    ASTPair::~ASTPair(&currentAST);
    return;
  }
LAB_0016a53a:
  pNVar5 = (NoViableAltException *)__cxa_allocate_exception(0x40);
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_50,this,1);
  NoViableAltException::NoViableAltException(pNVar5,&local_50);
  __cxa_throw(pNVar5,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException);
}

Assistant:

void GrpParser::glyphEntry() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST glyphEntry_AST = nullAST;
	
	try {      // for error handling
		{
		if ((LA(1)==IDENT) && (_tokenSet_22.member(LA(2)))) {
			glyphContents();
			astFactory.addASTChild(currentAST, returnAST);
		}
		else if ((LA(1)==IDENT) && (LA(2)==OP_LBRACE||LA(2)==OP_DOT)) {
			glyphAttrs();
			astFactory.addASTChild(currentAST, returnAST);
		}
		else {
			throw NoViableAltException(LT(1));
		}
		
		}
		{
		switch ( LA(1)) {
		case OP_SEMI:
		{
			RefAST tmp92_AST = nullAST;
			tmp92_AST = astFactory.create(LT(1));
			match(OP_SEMI);
			break;
		}
		case LITERAL_environment:
		case LITERAL_endenvironment:
		case IDENT:
		case LITERAL_table:
		case LITERAL_endtable:
		{
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		glyphEntry_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_21);
	}
	returnAST = glyphEntry_AST;
}